

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O0

void __thiscall axl::cry::AppStoreReceipt::AppStoreReceipt(AppStoreReceipt *this)

{
  long in_RDI;
  
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x14e580);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x14e593);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x14e5a8);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x14e5bd);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x14e5d2);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x14e5ea);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x14e602);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x14e61a);
  sl::
  List<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::mem::Delete<axl::cry::AppStoreIap>_>
  ::List((List<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::mem::Delete<axl::cry::AppStoreIap>_>
          *)0x14e62d);
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  return;
}

Assistant:

AppStoreReceipt::AppStoreReceipt() {
	m_receiptCreationTimestamp = 0;
	m_receiptExpirationTimestamp = 0;
}